

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::MultisampleRenderCase::init
          (MultisampleRenderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar2;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  char *ctx_00;
  bool supportsES32;
  MultisampleRenderCase *this_local;
  
  pRVar3 = gles31::Context::getRenderContext
                     ((this->super_MultisampleRenderCase).super_TestCase.m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  ctx_00 = (char *)(ulong)requiredApiType.m_bits;
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    this_00 = gles31::Context::getContextInfo
                        ((this->super_MultisampleRenderCase).super_TestCase.m_context);
    ctx_00 = "GL_OES_sample_variables";
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_sample_variables");
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,
                 "Test requires GL_OES_sample_variables extension or a context version 3.2 or higher."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                 ,0x119);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  iVar2 = MultisampleShaderRenderUtil::MultisampleRenderCase::init
                    (&this->super_MultisampleRenderCase,(EVP_PKEY_CTX *)ctx_00);
  return iVar2;
}

Assistant:

void MultisampleRenderCase::init (void)
{
	const bool	supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_sample_variables extension or a context version 3.2 or higher.");

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();
}